

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O2

Result * CoreML::Result::featureTypeInvariantError
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed,
                   FeatureType *actual)

{
  pointer pFVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  Result(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"Feature type invariant violation. Expected feature type ");
  FeatureType::toString_abi_cxx11_(&local_1d8,actual);
  poVar2 = std::operator<<(local_1a8,(string *)&local_1d8);
  std::operator<<(poVar2," to be one of: ");
  std::__cxx11::string::~string((string *)&local_1d8);
  lVar4 = 0;
  for (uVar3 = 0;
      pFVar1 = (allowed->
               super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(allowed->
                            super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar3 = uVar3 + 1) {
    FeatureType::toString_abi_cxx11_
              (&local_1d8,
               (FeatureType *)
               ((long)&(pFVar1->m_type).
                       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar4));
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar3 != ((long)(allowed->
                        super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(allowed->
                        super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
      std::operator<<(local_1a8,", ");
    }
    lVar4 = lVar4 + 0x10;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,(string *)&local_1d8)
  ;
  std::__cxx11::string::~string((string *)&local_1d8);
  __return_storage_ptr__->m_type = FEATURE_TYPE_INVARIANT_VIOLATION;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Result Result::featureTypeInvariantError(
      const std::vector<FeatureType>& allowed,
      const FeatureType& actual) {

    Result out;
    std::stringstream ss;
    ss << "Feature type invariant violation. Expected feature type ";
    ss << actual.toString() << " to be one of: ";
    for (size_t i=0; i<allowed.size(); i++) {
      ss << allowed[i].toString();
      if (i != allowed.size() - 1) {
        ss << ", ";
      }
    }
    out.m_message = ss.str();
    out.m_type = ResultType::FEATURE_TYPE_INVARIANT_VIOLATION;
    return out;
  }